

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare::operator()
          (ExtensionCompare *this,ExtensionEntry *a,ExtensionEntry *b)

{
  size_type sVar1;
  bool bVar2;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> local_30;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> local_18;
  
  sVar1 = (a->encoded_extendee)._M_string_length;
  if (sVar1 != 0) {
    local_30.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>.
    super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl
    ._M_len = sVar1 - 1;
    local_30.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>.
    super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl
    ._M_str = (a->encoded_extendee)._M_dataplus._M_p + 1;
    local_30.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>.
    super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
         (_Head_base<1UL,_int,_false>)a->extension_number;
    sVar1 = (b->encoded_extendee)._M_string_length;
    if (sVar1 != 0) {
      local_18.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>.
      super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_len = sVar1 - 1;
      local_18.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>.
      super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_str = (b->encoded_extendee)._M_dataplus._M_p + 1;
      local_18.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>.
      super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)b->extension_number;
      bVar2 = std::
              __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_0UL,_2UL>
              ::__less(&local_30,&local_18);
      return bVar2;
    }
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1,0);
}

Assistant:

bool operator()(const ExtensionEntry& a, const ExtensionEntry& b) const {
      return std::make_tuple(a.extendee(index), a.extension_number) <
             std::make_tuple(b.extendee(index), b.extension_number);
    }